

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expr __thiscall mp::CallExpr::arg(CallExpr *this,int index)

{
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> BVar1;
  undefined4 in_ESI;
  undefined4 in_stack_ffffffffffffffe8;
  
  impl((CallExpr *)0x19e9e7);
  BVar1 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                    ((Impl *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  return (Expr)(Impl *)BVar1.super_ExprBase.impl_;
}

Assistant:

Expr arg(int index) {
    MP_ASSERT(index >= 0 && index < num_args(), "index out of bounds");
    return Create<Expr>(impl()->args[index]);
  }